

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall
corr_stack::push(corr_stack *this,wchar_t *str,size_t strl,int dist,int repl,size_t ipos,
                vmdict_TrieNode *node,corr_type typ)

{
  void *pvVar1;
  undefined4 in_ECX;
  vmdict_TrieNode *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  wchar_t *in_R9;
  corr_state *unaff_retaddr;
  size_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  size_t in_stack_ffffffffffffffc0;
  undefined8 *puVar2;
  
  puVar2 = in_RDI;
  pvVar1 = corr_state::operator_new
                     (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
  corr_state::corr_state
            ((corr_state *)CONCAT44(in_ECX,in_R8D),in_R9,(size_t)in_RDI,(int)((ulong)pvVar1 >> 0x20)
             ,(int)pvVar1,in_stack_ffffffffffffffc0,in_RSI,(corr_type)puVar2,unaff_retaddr);
  *in_RDI = pvVar1;
  return;
}

Assistant:

void push(const wchar_t *str, size_t strl, int dist, int repl,
              size_t ipos, vmdict_TrieNode *node, corr_type typ)
    {
        top = new (strl) corr_state(
            str, strl, dist, repl, ipos, node, typ, top);
    }